

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

string * __thiscall
duckdb::Catalog::GetDefaultTableSchema_abi_cxx11_(string *__return_storage_ptr__,Catalog *this)

{
  size_type sVar1;
  pointer pcVar2;
  
  sVar1 = (this->default_table_schema)._M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"main","");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->default_table_schema)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string Catalog::GetDefaultTableSchema() const {
	return !default_table_schema.empty() ? default_table_schema : DEFAULT_SCHEMA;
}